

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

void __thiscall
moira::StrWriter::fullExtension<(moira::Mode)10,(moira::Size)4>
          (StrWriter *this,Ea<(moira::Mode)10,_(moira::Size)4> *ea)

{
  uint uVar1;
  u32 uVar2;
  u32 uVar3;
  uint uVar4;
  char *str;
  bool bVar5;
  
  uVar1 = ea->ext1;
  if ((uVar1 & 0xe2) == 0xc0 || (uVar1 & 0xe4) == 0xc4) {
    str = "0";
  }
  else {
    uVar2 = ea->ext2;
    uVar4 = uVar1 & 7;
    uVar3 = ea->ext3;
    operator<<(this,"(");
    if (4 < uVar4 || uVar4 - 1 < 3) {
      operator<<(this,"[");
    }
    bVar5 = uVar2 != 0;
    if (bVar5) {
      operator<<(this,(Int)(int)(short)uVar2);
    }
    if (-1 < (char)uVar1) {
      if (bVar5) {
        operator<<(this,",");
      }
      operator<<(this,"PC");
      bVar5 = true;
    }
    if (4 < uVar4) {
      operator<<(this,"]");
      bVar5 = true;
    }
    if ((uVar1 & 0x40) == 0) {
      if (bVar5) {
        operator<<(this,",");
      }
      operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
      if ((uVar1 >> 0xb & 1) == 0) {
        operator<<();
      }
      else {
        operator<<(this);
      }
      operator<<(this,(Scale)(uVar1 >> 9 & 3));
      bVar5 = true;
    }
    if (uVar4 - 1 < 3) {
      operator<<(this,"]");
      bVar5 = true;
    }
    str = ")";
    if (uVar3 != 0) {
      if (bVar5) {
        operator<<(this,",");
      }
      operator<<(this,(Int)(int)(short)uVar3);
    }
  }
  operator<<(this,str);
  return;
}

Assistant:

void
StrWriter::fullExtension(const Ea<M,S> &ea)
{
    assert(M == 6 || M == 10);

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
    // -----------------------------------------------------------------------

    u16  reg   = xxxx____________ (ea.ext1);
    u16  lw    = ____x___________ (ea.ext1);
    u16  scale = _____xx_________ (ea.ext1);
    u16  bs    = ________x_______ (ea.ext1);
    u16  is    = _________x______ (ea.ext1);
    u16  iis   = _____________xxx (ea.ext1);
    u32  base  = ea.ext2;
    u32  outer = ea.ext3;

    bool preindex      = (iis > 0 && iis < 4);
    bool postindex     = (iis > 4);
    bool effectiveZero = (ea.ext1 & 0xe4) == 0xC4 || (ea.ext1 & 0xe2) == 0xC0;

    if (effectiveZero) {
        *this << "0";
        return;
    }

    *this << "(";

    bool comma = false;
    if (preindex || postindex)
    {
        *this << "[";
    }
    if (base)
    {
        *this << Int{(i16)base};
        comma = true;
    }
    if (!bs)
    {
        if (comma) *this << ",";
        M == 10 ? *this << "PC" : *this << An{ea.reg};
        comma = true;
    }
    if (postindex)
    {
        *this << "]";
        comma = true;
    }
    if (!is)
    {
        if (comma) *this << ",";
        *this << Rn{reg};
        lw ? (*this << Sz<Long>{}) : (*this << Sz<Word>{});
        *this << Scale{scale};
        comma = true;
    }
    if (preindex)
    {
        *this << "]";
        comma = true;
    }
    if(outer)
    {
        if (comma) *this << ",";
        *this << Int((i16)outer);
    }

    *this << ")";
}